

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BondStamp.cpp
# Opt level: O3

void __thiscall OpenMD::BondStamp::validate(BondStamp *this)

{
  double dVar1;
  pointer pcVar2;
  long *local_58 [2];
  long local_48 [2];
  long *local_38;
  long local_30;
  long local_28 [2];
  
  DataHolder::validate(&this->super_DataHolder);
  if ((this->BondOrder).super_ParameterBase.empty_ == false) {
    isPositive();
    dVar1 = (this->BondOrder).data_;
    if (local_58[0] != local_48) {
      operator_delete(local_58[0],local_48[0] + 1);
    }
    if (dVar1 <= 0.0) {
      pcVar2 = (this->BondOrder).super_ParameterBase.keyword_._M_dataplus._M_p;
      isPositive();
      local_58[0] = local_48;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_58,local_38,local_30 + (long)local_38);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar2,local_58[0]);
      if (local_58[0] != local_48) {
        operator_delete(local_58[0],local_48[0] + 1);
      }
      if (local_38 != local_28) {
        operator_delete(local_38,local_28[0] + 1);
      }
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  return;
}

Assistant:

void BondStamp::validate() {
    DataHolder::validate();
    CheckParameter(BondOrder, isPositive());
  }